

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O0

char * cht_Morph(player_t *player,PClassPlayerPawn *morphclass,bool quickundo)

{
  bool bVar1;
  MetaClass *pMVar2;
  char *pcVar3;
  int local_34;
  int style;
  PClassPlayerPawn *oldclass;
  bool quickundo_local;
  PClassPlayerPawn *morphclass_local;
  player_t *player_local;
  
  if (player->mo != (APlayerPawn *)0x0) {
    pMVar2 = APlayerPawn::GetClass(player->mo);
    local_34 = 4;
    if (gameinfo.gametype == GAME_Hexen) {
      local_34 = 0xc;
    }
    if (player->morphTics == 0) {
      bVar1 = P_MorphPlayer(player,player,morphclass,0,local_34,(PClassActor *)0x0,
                            (PClassActor *)0x0);
      if (bVar1) {
        pcVar3 = FStringTable::operator()(&GStrings,"TXT_STRANGE");
        return pcVar3;
      }
    }
    else {
      bVar1 = P_UndoPlayerMorph(player,player,0,false);
      if (bVar1) {
        if (((!quickundo) && (pMVar2 != morphclass)) &&
           (bVar1 = P_MorphPlayer(player,player,morphclass,0,local_34,(PClassActor *)0x0,
                                  (PClassActor *)0x0), bVar1)) {
          pcVar3 = FStringTable::operator()(&GStrings,"TXT_STRANGER");
          return pcVar3;
        }
        pcVar3 = FStringTable::operator()(&GStrings,"TXT_NOTSTRANGE");
        return pcVar3;
      }
    }
  }
  player_local = (player_t *)0x8b3a67;
  return (char *)player_local;
}

Assistant:

const char *cht_Morph (player_t *player, PClassPlayerPawn *morphclass, bool quickundo)
{
	if (player->mo == NULL)
	{
		return "";
	}
	PClassPlayerPawn *oldclass = player->mo->GetClass();

	// Set the standard morph style for the current game
	int style = MORPH_UNDOBYTOMEOFPOWER;
	if (gameinfo.gametype == GAME_Hexen) style |= MORPH_UNDOBYCHAOSDEVICE;

	if (player->morphTics)
	{
		if (P_UndoPlayerMorph (player, player))
		{
			if (!quickundo && oldclass != morphclass && P_MorphPlayer (player, player, morphclass, 0, style))
			{
				return GStrings("TXT_STRANGER");
			}
			return GStrings("TXT_NOTSTRANGE");
		}
	}
	else if (P_MorphPlayer (player, player, morphclass, 0, style))
	{
		return GStrings("TXT_STRANGE");
	}
	return "";
}